

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::member_location_attribute_qualifier_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  uint32_t type_id;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  spirv_cross local_80 [32];
  spirv_cross local_60 [48];
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t locn;
  uint32_t comp;
  long lStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *quals;
  
  lStack_20 = CONCAT44(in_register_00000014,index);
  locn._3_1_ = 0;
  comp = in_ECX;
  type_local = type;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  type_id = TypedID::operator_cast_to_unsigned_int((TypedID *)(lStack_20 + 8));
  local_30 = get_member_location((CompilerMSL *)type,type_id,comp,&local_2c);
  if (local_30 != 0xffffffff) {
    ::std::__cxx11::string::operator+=((string *)this,"user(locn");
    convert_to_string<unsigned_int,_0>(local_60,&local_30);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
    if ((local_2c != 0xffffffff) && (local_2c != 0)) {
      ::std::__cxx11::string::operator+=((string *)this,"_");
      convert_to_string<unsigned_int,_0>(local_80,&local_2c);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_80);
      ::std::__cxx11::string::~string((string *)local_80);
    }
    ::std::__cxx11::string::operator+=((string *)this,")");
  }
  return this;
}

Assistant:

string CompilerMSL::member_location_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	string quals;
	uint32_t comp;
	uint32_t locn = get_member_location(type.self, index, &comp);
	if (locn != k_unknown_location)
	{
		quals += "user(locn";
		quals += convert_to_string(locn);
		if (comp != k_unknown_component && comp != 0)
		{
			quals += "_";
			quals += convert_to_string(comp);
		}
		quals += ")";
	}
	return quals;
}